

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::ByteCodeGenerator
          (ByteCodeGenerator *this,ScriptContext *scriptContext,ScopeInfo *parentScopeInfo)

{
  ScopeInfo *parentScopeInfo_local;
  ScriptContext *scriptContext_local;
  ByteCodeGenerator *this_local;
  
  this->scriptContext = scriptContext;
  this->alloc = (ArenaAllocator *)0x0;
  this->flags = 0;
  this->funcInfoStack = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->currentScope = (Scope *)0x0;
  this->globalScope = (Scope *)0x0;
  this->parentScopeInfo = parentScopeInfo;
  Js::ByteCodeWriter::ByteCodeWriter(&this->m_writer);
  this->pRootFunc = (ParseableFunctionInfo *)0x0;
  this->jumpCleanupList = (JumpCleanupList *)0x0;
  this->dynamicScopeCount = 0;
  this->isBinding = false;
  this->inDestructuredPattern = false;
  this->pCurrentFunction = (FunctionBody *)0x0;
  this->forceStrictModeForClassComputedPropertyName = false;
  JsUtil::DoublyLinkedList<ByteCodeGenerator::TryScopeRecord,_Memory::ArenaAllocator>::
  DoublyLinkedList(&this->tryScopeRecordsList);
  Js::ByteCodeWriter::Create(&this->m_writer);
  return;
}

Assistant:

ByteCodeGenerator::ByteCodeGenerator(Js::ScriptContext* scriptContext, Js::ScopeInfo* parentScopeInfo) :
    alloc(nullptr),
    scriptContext(scriptContext),
    flags(0),
    funcInfoStack(nullptr),
    jumpCleanupList(nullptr),
    pRootFunc(nullptr),
    pCurrentFunction(nullptr),
    globalScope(nullptr),
    currentScope(nullptr),
    parentScopeInfo(parentScopeInfo),
    dynamicScopeCount(0),
    isBinding(false),
    inDestructuredPattern(false)
{
    m_writer.Create();
}